

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O1

bool __thiscall Am_Inter_Location::operator>=(Am_Inter_Location *this,Am_Inter_Location *test)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Inter_Location_Data *pAVar6;
  Am_Inter_Location_Data *pAVar7;
  bool bVar8;
  int iVar9;
  int test_right;
  int test_top;
  int test_left;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  pAVar6 = this->data;
  if (pAVar6 == (Am_Inter_Location_Data *)0x0) {
    Am_Error("Am_Inter_Location not initialized");
  }
  pAVar7 = test->data;
  if (pAVar7 != (Am_Inter_Location_Data *)0x0) {
    if (pAVar6->as_line == true) {
      Am_Error("Can\'t test contain inside an Am_Inter_Location that is a Line");
    }
    iVar1 = (pAVar6->data).rect.left;
    iVar2 = (pAVar6->data).rect.top;
    iVar9 = (pAVar6->data).rect.width;
    iVar3 = (pAVar6->data).rect.height;
    iVar4 = (pAVar7->data).rect.left;
    iVar5 = (pAVar7->data).rect.top;
    local_40 = (pAVar7->data).rect.width;
    if (pAVar7->as_line == true) {
      local_3c = (pAVar7->data).rect.height;
      local_34 = local_40;
      if (iVar4 < local_40) {
        local_34 = iVar4;
      }
      if (local_40 < iVar4) {
        local_40 = iVar4;
      }
      local_38 = local_3c;
      if (iVar5 < local_3c) {
        local_38 = iVar5;
      }
      if (local_3c < iVar5) {
        local_3c = iVar5;
      }
    }
    else {
      local_40 = iVar4 + local_40 + 1;
      local_3c = (pAVar7->data).rect.height + iVar5 + 1;
      local_38 = iVar5;
      local_34 = iVar4;
    }
    bVar8 = Am_Object::operator!=(&pAVar6->ref_obj,&pAVar7->ref_obj);
    if (bVar8) {
      bVar8 = Am_Translate_Coordinates
                        (&test->data->ref_obj,local_34,local_38,&this->data->ref_obj,&local_34,
                         &local_38);
      if (!bVar8) {
        return false;
      }
      Am_Translate_Coordinates
                (&test->data->ref_obj,local_40,local_3c,&this->data->ref_obj,&local_40,&local_3c);
    }
    bVar8 = false;
    if (((iVar1 <= local_34) && (iVar9 = iVar1 + 1 + iVar9, local_34 <= iVar9)) &&
       (bVar8 = false, local_40 <= iVar9)) {
      iVar9 = iVar2 + iVar3 + 1;
      bVar8 = (local_3c <= iVar9 && local_38 <= iVar9) && iVar2 <= local_38;
    }
    return bVar8;
  }
  Am_Error("Other Am_Inter_Location not initialized");
}

Assistant:

bool
Am_Inter_Location::operator>=(const Am_Inter_Location &test) const
{
  int test_left, test_top, test_right, test_bottom;
  int my_left, my_top, my_right, my_bottom;

  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  if (!test.data)
    Am_Error("Other Am_Inter_Location not initialized");
  if (data->as_line)
    Am_Error("Can't test contain inside an Am_Inter_Location that is a Line");

  my_left = data->data.rect.left;
  my_top = data->data.rect.top;
  my_right = my_left + data->data.rect.width + 1;
  my_bottom = my_top + data->data.rect.height + 1;

  if (test.data->as_line) {
    test_left = test.data->data.line.x1;
    test_top = test.data->data.line.y1;
    test_right = test.data->data.line.x2;
    test_bottom = test.data->data.line.y2;
    isort(test_left, test_right, test_left, test_right);
    isort(test_top, test_bottom, test_top, test_bottom);
  } else {
    test_left = test.data->data.rect.left;
    test_top = test.data->data.rect.top;
    test_right = test_left + test.data->data.rect.width + 1;
    test_bottom = test_top + test.data->data.rect.height + 1;
  }

  if (data->ref_obj != test.data->ref_obj) {
    if (!Am_Translate_Coordinates(test.data->ref_obj, test_left, test_top,
                                  data->ref_obj, test_left, test_top))
      return false; //not in the same window
    Am_Translate_Coordinates(test.data->ref_obj, test_right, test_bottom,
                             data->ref_obj, test_right, test_bottom);
  }

  //now ready to do the comparisons
  if (test_left < my_left || test_left > my_right || test_right > my_right)
    return false;
  if (test_top < my_top || test_top > my_bottom || test_bottom > my_bottom)
    return false;
  return true;
}